

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Carrier.cpp
# Opt level: O0

istream * operator>>(istream *is,Carrier *item)

{
  int iVar1;
  istream *piVar2;
  void *pvVar3;
  string local_68 [48];
  string local_38 [8];
  string tmpcate;
  Carrier *item_local;
  istream *is_local;
  
  std::__cxx11::string::string(local_38);
  piVar2 = std::operator>>(is,(string *)item);
  piVar2 = std::operator>>(piVar2,local_38);
  pvVar3 = (void *)std::istream::operator>>(piVar2,&item->gridNum);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,item->gridSize);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,item->gridSize + 1);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,item->gridSize + 2);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,item->gridSize + 3);
  std::istream::operator>>(pvVar3,&item->atk);
  std::__cxx11::string::string(local_68,local_38);
  iVar1 = CARRIER_CATE_convert((string *)local_68);
  item->category = iVar1;
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  return is;
}

Assistant:

istream &operator>>(istream &is,Carrier &item){
    string tmpcate;
    is>>item.name>>tmpcate>>item.gridNum>>item.gridSize[0]>>item.gridSize[1]>>item.gridSize[2]>>item.gridSize[3]>>item.atk;
    item.category=CARRIER_CATE_convert(tmpcate);
    return is;
}